

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_lex.c
# Opt level: O0

yajl_tok yajl_lex_peek(yajl_lexer lexer,uchar *jsonText,size_t jsonTextLen,size_t offset)

{
  undefined4 uVar1;
  undefined8 uVar2;
  yajl_tok yVar3;
  size_t len;
  long in_RDI;
  yajl_tok tok;
  uint bufInUse;
  size_t bufOff;
  size_t bufLen;
  size_t outLen;
  uchar *outBuf;
  uchar *in_stack_00000048;
  yajl_lexer in_stack_00000050;
  
  len = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18));
  uVar2 = *(undefined8 *)(in_RDI + 0x20);
  uVar1 = *(undefined4 *)(in_RDI + 0x28);
  yVar3 = yajl_lex_lex(in_stack_00000050,in_stack_00000048,(size_t)lexer,(size_t *)jsonText,
                       (uchar **)jsonTextLen,(size_t *)offset);
  *(undefined8 *)(in_RDI + 0x20) = uVar2;
  *(undefined4 *)(in_RDI + 0x28) = uVar1;
  yajl_buf_truncate(*(yajl_buf *)(in_RDI + 0x18),len);
  return yVar3;
}

Assistant:

yajl_tok yajl_lex_peek(yajl_lexer lexer, const unsigned char * jsonText,
                       size_t jsonTextLen, size_t offset)
{
    const unsigned char * outBuf;
    size_t outLen;
    size_t bufLen = yajl_buf_len(lexer->buf);
    size_t bufOff = lexer->bufOff;
    unsigned int bufInUse = lexer->bufInUse;
    yajl_tok tok;

    tok = yajl_lex_lex(lexer, jsonText, jsonTextLen, &offset,
                       &outBuf, &outLen);

    lexer->bufOff = bufOff;
    lexer->bufInUse = bufInUse;
    yajl_buf_truncate(lexer->buf, bufLen);

    return tok;
}